

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

uint32 __thiscall Clasp::UncoreMinimize::analyze(UncoreMinimize *this,Solver *s)

{
  uint *puVar1;
  uint uVar2;
  size_type sVar3;
  pointer pLVar4;
  pointer puVar5;
  pointer pLVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  size_type sVar11;
  bool bVar12;
  uint local_54;
  LitPair p;
  
  bVar12 = (this->conflict_).ebo_.size == 0;
  if (bVar12) {
    local_54 = (s->levels_).super_type.ebo_.size;
    uVar9 = local_54;
  }
  else {
    pLVar4 = (this->conflict_).ebo_.buf;
    p.lit.rep_ = pLVar4->rep_;
    p.id = pLVar4[1].rep_;
    Todo::add(&this->todo_,&p,(this->litData_).ebo_.buf[p.id - 1].weight);
    local_54 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(p.lit.rep_ & 0xfffffffc)) >>
               4;
    uVar9 = (s->levels_).super_type.ebo_.size;
  }
  uVar8 = (uint)!bVar12;
  (this->conflict_).ebo_.size = 0;
  if (this->eRoot_ < uVar9) {
    Solver::resolveToCore(s,&this->conflict_);
    pLVar4 = (this->conflict_).ebo_.buf;
    uVar9 = (this->conflict_).ebo_.size;
    puVar5 = (s->assign_).assign_.ebo_.buf;
    for (lVar10 = 0; (ulong)uVar9 << 2 != lVar10; lVar10 = lVar10 + 4) {
      uVar2 = *(uint *)((long)&pLVar4->rep_ + lVar10);
      puVar1 = (uint *)((long)puVar5 + (ulong)(uVar2 & 0xfffffffc));
      *puVar1 = *puVar1 | (uVar2 & 2) * 2 + 4;
    }
    sVar3 = (this->conflict_).ebo_.size;
    pLVar6 = (this->assume_).ebo_.buf;
    uVar9 = (this->assume_).ebo_.size;
    lVar10 = 0;
    sVar11 = sVar3;
    while (((ulong)uVar9 << 3 != lVar10 && (sVar11 != 0))) {
      uVar2 = *(uint *)((long)&(pLVar6->lit).rep_ + lVar10);
      uVar7 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar2 & 0xfffffffc));
      if (((((uVar2 & 2) * 2 + 4 & uVar7) != 0) && (uVar7 = uVar7 >> 4, this->eRoot_ < uVar7)) &&
         (uVar7 <= this->aTop_)) {
        if (uVar7 < local_54) {
          local_54 = uVar7;
        }
        p.lit.rep_ = uVar2 & 0xfffffffe ^ 2;
        p.id = *(uint32 *)((long)&pLVar6->id + lVar10);
        Todo::add(&this->todo_,&p,(this->litData_).ebo_.buf[p.id - 1].weight);
        puVar1 = (s->assign_).assign_.ebo_.buf + (uVar2 >> 2);
        *puVar1 = *puVar1 & 0xfffffff3;
        sVar11 = sVar11 - 1;
      }
      lVar10 = lVar10 + 8;
    }
    uVar8 = sVar3 + uVar8;
    popPath(this,s,(local_54 - 1) + (uint)(local_54 == 0));
    if (sVar11 != 0) {
      pLVar4 = (this->conflict_).ebo_.buf;
      uVar9 = (this->conflict_).ebo_.size;
      puVar5 = (s->assign_).assign_.ebo_.buf;
      for (lVar10 = 0; (ulong)uVar9 << 2 != lVar10; lVar10 = lVar10 + 4) {
        puVar1 = (uint *)((long)puVar5 +
                         (ulong)(*(uint *)((long)&pLVar4->rep_ + lVar10) & 0xfffffffc));
        *puVar1 = *puVar1 & 0xfffffff3;
      }
      uVar8 = uVar8 - sVar11;
    }
    (this->conflict_).ebo_.size = 0;
  }
  return uVar8;
}

Assistant:

uint32 UncoreMinimize::analyze(Solver& s) {
	uint32 cs    = 0;
	uint32 minDL = s.decisionLevel();
	if (!conflict_.empty()) {
		LitPair p(conflict_[0], conflict_[1].rep());
		assert(s.isTrue(p.lit));
		todo_.add(p, getData(p.id).weight);
		minDL = s.level(p.lit.var());
		cs = 1;
	}
	conflict_.clear();
	if (s.decisionLevel() <= eRoot_) {
		return cs;
	}
	s.resolveToCore(conflict_);
	for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) {
		s.markSeen(*it);
	}
	// map marked root decisions back to our assumptions
	uint32 roots = sizeVec(conflict_), dl;
	cs += roots;
	for (LitSet::iterator it = assume_.begin(), end = assume_.end(); it != end && roots; ++it) {
		Literal p = it->lit;
		if (s.seen(p) && (dl = s.level(p.var())) > eRoot_ && dl <= aTop_) {
			assert(p == s.decision(dl) && getData(it->id).assume);
			if (dl < minDL) { minDL = dl; }
			todo_.add(LitPair(~p, it->id), getData(it->id).weight);
			assert(s.isFalse(~p));
			s.clearSeen(p.var());
			--roots;
		}
	}
	popPath(s, minDL - (minDL != 0));
	if (roots) { // clear remaining levels - can only happen if someone messed with our assumptions
		cs -= roots;
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) { s.clearSeen(it->var()); }
	}
	conflict_.clear();
	return cs;
}